

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

int ON_wString::FormatVargsIntoBuffer
              (wchar_t *buffer,size_t buffer_capacity,wchar_t *format,__va_list_tag *args)

{
  wchar_t *__format;
  int local_2ac;
  int local_28c;
  undefined8 uStack_288;
  int len;
  va_list args_copy;
  undefined1 local_258 [8];
  ON_wStringBuffer clang_format_buffer;
  wchar_t clang_format_stack_buffer [128];
  __va_list_tag *args_local;
  wchar_t *format_local;
  size_t buffer_capacity_local;
  wchar_t *buffer_local;
  
  if ((buffer == (wchar_t *)0x0) || (buffer_capacity == 0)) {
    buffer_local._4_4_ = -1;
  }
  else {
    *buffer = L'\0';
    if ((format == (wchar_t *)0x0) || (*format == L'\0')) {
      buffer_local._4_4_ = 0;
    }
    else {
      ON_wStringBuffer::ON_wStringBuffer
                ((ON_wStringBuffer *)local_258,
                 (wchar_t *)&clang_format_buffer.m_heap_buffer_capacity,0x80);
      __format = ConvertToCLangFormat(format,(ON_wStringBuffer *)local_258);
      args_copy[0].overflow_arg_area = args->reg_save_area;
      uStack_288._0_4_ = args->gp_offset;
      uStack_288._4_4_ = args->fp_offset;
      args_copy[0]._0_8_ = args->overflow_arg_area;
      local_28c = vswprintf(buffer,buffer_capacity,__format,&uStack_288);
      if (buffer_capacity <= (ulong)(long)local_28c) {
        local_28c = -1;
      }
      if (local_28c < 1) {
        local_2ac = 0;
      }
      else {
        local_2ac = local_28c;
      }
      buffer[local_2ac] = L'\0';
      buffer[buffer_capacity - 1] = L'\0';
      buffer_local._4_4_ = local_28c;
      ON_wStringBuffer::~ON_wStringBuffer((ON_wStringBuffer *)local_258);
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int ON_wString::FormatVargsIntoBuffer(
  wchar_t* buffer,
  size_t buffer_capacity,
  const wchar_t* format,
  va_list args
  )
{
  if (0 == buffer || buffer_capacity <= 0)
    return -1;
  buffer[0] = 0;

  if ( nullptr == format || 0 == format[0] )
    return 0;
  
#if defined(ON_COMPILER_CLANG)
  // CLang requires %ls to properly format a const wchar_t* parameter
  wchar_t clang_format_stack_buffer[128];
  ON_wStringBuffer clang_format_buffer(clang_format_stack_buffer, sizeof(clang_format_stack_buffer) / sizeof(clang_format_stack_buffer[0]));
  format = ConvertToCLangFormat(
    format,
    clang_format_buffer
    );

  va_list args_copy;
  va_copy (args_copy, args);
  // Cannot use Apple's vswprintf_l() because it's buggy. 
  // This means we cannot be certain that a period will be used for a decimal point in formatted printing.
  // For details, see comments below in ON_wString::FormatVargsOutputCount().
  //int len = vswprintf_l(buffer, buffer_capacity, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
  int len = vswprintf(buffer, buffer_capacity, format, args_copy);
  va_end(args_copy);
  
#else

#if defined(ON_COMPILER_GNU)
  va_list args_copy;
  va_copy (args_copy, args);
  int len = vswprintf(buffer, buffer_capacity, format, args_copy);
  va_end(args_copy);
#else
  // Using ON_Locale::Ordinal.NumericLocalePtr() insures that a period 
  // will be use for the decimal point in formatted printing.
  int len = _vswprintf_p_l(buffer, buffer_capacity, format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
#endif
  if (((size_t)len) >= buffer_capacity)
    len = -1;
  buffer[(len <= 0) ? 0 : len] = 0;
  buffer[buffer_capacity - 1] = 0;
  return len;
}